

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_POPone(Z80Reg r16)

{
  Z80Reg local_18 [2];
  int e [3];
  Z80Reg r16_local;
  
  e[0] = -1;
  local_18[0] = Z80_UNK;
  local_18[1] = Z80_UNK;
  if (r16 == Z80_BC) {
    local_18[0] = 0xc1;
    local_18[1] = Z80_UNK;
  }
  else if (r16 == Z80_DE) {
    local_18[0] = 0xd1;
    local_18[1] = Z80_UNK;
  }
  else if (r16 == Z80_HL) {
    local_18[0] = 0xe1;
    local_18[1] = Z80_UNK;
  }
  else if (r16 == Z80_AF) {
    local_18[0] = 0xf1;
    local_18[1] = Z80_UNK;
  }
  else if ((r16 == Z80_IX) || (r16 == Z80_IY)) {
    local_18[1] = 0xe1;
    local_18[0] = r16;
  }
  e[1] = r16;
  EmitBytes(local_18,true);
  return;
}

Assistant:

static void OpCode_POPone(const Z80Reg r16) {
		int e[] { -1, -1, -1 };
		switch (r16) {
		case Z80_AF:
			e[0] = 0xf1; break;
		case Z80_BC:
			e[0] = 0xc1; break;
		case Z80_DE:
			e[0] = 0xd1; break;
		case Z80_HL:
			e[0] = 0xe1; break;
		case Z80_IX:
		case Z80_IY:
			e[0] = r16; e[1] = 0xe1; break;
		default:
			break;
		}
		EmitBytes(e, true);
	}